

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::DoGenerate(cmMakefile *this,cmLocalGenerator *lg)

{
  bool bVar1;
  reference this_00;
  BT<cmMakefile::GeneratorAction> *action;
  iterator __end1;
  iterator __begin1;
  vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
  *__range1;
  cmLocalGenerator *lg_local;
  cmMakefile *this_local;
  
  ExpandVariablesCMP0019(this);
  __end1 = std::
           vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ::begin(&this->GeneratorActions);
  action = (BT<cmMakefile::GeneratorAction> *)
           std::
           vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ::end(&this->GeneratorActions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BT<cmMakefile::GeneratorAction>_*,_std::vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>_>
                                *)&action);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<BT<cmMakefile::GeneratorAction>_*,_std::vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>_>
              ::operator*(&__end1);
    GeneratorAction::operator()(&this_00->Value,lg,&this_00->Backtrace);
    __gnu_cxx::
    __normal_iterator<BT<cmMakefile::GeneratorAction>_*,_std::vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>_>
    ::operator++(&__end1);
  }
  this->GeneratorActionsInvoked = true;
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,(anonymous_namespace)::file_not_persistent>
            (&this->OutputFiles);
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,(anonymous_namespace)::file_not_persistent>
            (&this->ListFiles);
  return;
}

Assistant:

void cmMakefile::DoGenerate(cmLocalGenerator& lg)
{
  // do all the variable expansions here
  this->ExpandVariablesCMP0019();

  // give all the commands a chance to do something
  // after the file has been parsed before generation
  for (auto& action : this->GeneratorActions) {
    action.Value(lg, action.Backtrace);
  }
  this->GeneratorActionsInvoked = true;

  // go through all configured files and see which ones still exist.
  // we don't want cmake to re-run if a configured file is created and deleted
  // during processing as that would make it a transient file that can't
  // influence the build process
  cm::erase_if(this->OutputFiles, file_not_persistent());

  // if a configured file is used as input for another configured file,
  // and then deleted it will show up in the input list files so we
  // need to scan those too
  cm::erase_if(this->ListFiles, file_not_persistent());
}